

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition
          (MessageGenerator *this,Printer *p)

{
  int iVar1;
  Printer *pPVar2;
  int iVar3;
  undefined8 extraout_RAX;
  Options *in_RCX;
  long lVar4;
  bool need_to_emit_cached_size;
  size_t sizeof_has_bits;
  char local_992;
  anon_class_1_0_00000001 local_991;
  undefined1 *local_990;
  undefined8 local_988;
  undefined1 local_980;
  undefined7 uStack_97f;
  undefined8 uStack_978;
  undefined1 *local_970;
  undefined8 local_968;
  undefined1 local_960;
  undefined7 uStack_95f;
  undefined8 uStack_958;
  undefined1 *local_950;
  undefined8 local_948;
  undefined1 local_940;
  undefined7 uStack_93f;
  undefined8 uStack_938;
  undefined1 *local_930;
  undefined8 local_928;
  undefined1 local_920;
  undefined7 uStack_91f;
  undefined8 uStack_918;
  undefined1 *local_910;
  undefined8 local_908;
  undefined1 local_900;
  undefined7 uStack_8ff;
  undefined8 uStack_8f8;
  undefined1 *local_8f0;
  undefined8 local_8e8;
  undefined1 local_8e0;
  undefined7 uStack_8df;
  undefined8 uStack_8d8;
  long *local_8d0 [2];
  long local_8c0 [2];
  undefined1 local_8b0 [8];
  undefined8 local_8a8;
  undefined1 local_8a0;
  undefined7 uStack_89f;
  undefined8 uStack_898;
  ctrl_t *local_890;
  MaybeInitializedPtr local_888;
  ctrl_t local_880;
  undefined7 uStack_87f;
  long lStack_878;
  pointer local_870;
  size_type local_868;
  undefined1 local_860 [16];
  undefined1 *local_850;
  undefined8 local_848;
  undefined1 local_840;
  undefined7 uStack_83f;
  undefined8 uStack_838;
  Printer *local_830;
  Printer *local_828;
  long local_820;
  undefined1 local_818 [32];
  _Alloc_hider local_7f8;
  size_type sStack_7f0;
  code *local_7e8;
  code *local_7e0;
  undefined1 local_7d8;
  char *local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  undefined1 local_7b0;
  undefined1 local_768;
  HeapOrSoo local_760;
  ctrl_t local_750 [8];
  long lStack_748;
  undefined8 *local_740;
  Descriptor *pDStack_738;
  code *local_730;
  code *local_728;
  undefined1 local_720;
  pointer local_718;
  pointer local_710;
  undefined1 local_708 [16];
  undefined1 local_6f8;
  undefined1 local_6b0;
  ExtensionGenerator **local_6a8;
  pointer local_6a0;
  ExtensionGenerator *local_698 [2];
  __uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  local_688;
  __uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  _Stack_680;
  code *local_678;
  code *local_670;
  undefined1 local_668;
  HeapOrSoo local_660;
  ctrl_t local_650 [16];
  undefined1 local_640;
  undefined1 local_5f8;
  long *local_5f0;
  undefined8 local_5e8;
  long local_5e0;
  undefined8 uStack_5d8;
  undefined8 *local_5d0;
  undefined8 uStack_5c8;
  code *local_5c0;
  code *local_5b8;
  undefined1 local_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588;
  undefined1 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 *local_518;
  undefined8 uStack_510;
  code *local_508;
  code *local_500;
  undefined1 local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0;
  undefined1 local_488;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  undefined8 *local_460;
  undefined8 uStack_458;
  code *local_450;
  code *local_448;
  undefined1 local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  undefined8 *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_830 = p;
  SimpleBaseClass_abi_cxx11_
            ((string *)local_818,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((undefined1 *)local_818._0_8_ != local_818 + 0x10) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
  }
  pPVar2 = local_830;
  local_992 = local_818._8_8_ == 0;
  iVar1 = this->max_has_bit_index_ + 0x1f;
  iVar3 = this->max_has_bit_index_ + 0x3e;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  local_820 = (long)(iVar3 >> 5);
  local_870 = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"extension_set","");
  if (local_870 == local_860) {
    local_818._24_8_ = local_860._8_8_;
    local_818._0_8_ = local_818 + 0x10;
  }
  else {
    local_818._0_8_ = local_870;
  }
  local_818._8_8_ = local_868;
  local_868 = 0;
  local_860[0] = '\0';
  local_870 = local_860;
  local_7f8._M_p = (pointer)operator_new(0x18);
  *(MessageGenerator **)local_7f8._M_p = this;
  *(Printer ***)(local_7f8._M_p + 8) = &local_830;
  local_7f8._M_p[0x10] = '\0';
  local_7e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  sStack_7f0 = 0;
  local_7e8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_7d8 = 1;
  local_7d0 = local_7c8._M_local_buf + 8;
  local_7c8._M_allocated_capacity = 0;
  local_7c8._M_local_buf[8] = '\0';
  local_7b0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_7d0,0,(char *)0x0,0x36a4ec);
  local_768 = 0;
  local_890 = &local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"tracker","");
  local_760.heap.control = local_750;
  if (local_890 == &local_880) {
    lStack_748 = lStack_878;
  }
  else {
    local_760.heap.control = local_890;
  }
  local_828 = pPVar2;
  local_760.heap.slot_array = local_888;
  local_888.p = (void *)0x0;
  local_880 = ~kSentinel;
  local_890 = &local_880;
  local_740 = (undefined8 *)operator_new(0x18);
  *local_740 = this;
  local_740[1] = &local_830;
  *(undefined1 *)(local_740 + 2) = 0;
  local_728 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  pDStack_738 = (Descriptor *)0x0;
  local_730 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_720 = 1;
  local_718 = (pointer)local_708;
  local_710 = (pointer)0x0;
  local_708[0] = 0;
  local_6f8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_718,0,(char *)0x0,0x36a4ec);
  local_6b0 = 0;
  local_8b0 = (undefined1  [8])&local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"inlined_string_donated","");
  local_6a8 = local_698;
  if (local_8b0 == (undefined1  [8])&local_8a0) {
    local_698[1] = (ExtensionGenerator *)uStack_898;
  }
  else {
    local_6a8 = (ExtensionGenerator **)local_8b0;
  }
  local_6a0 = local_8a8;
  local_8a8 = (pointer)0x0;
  local_8a0 = 0;
  local_8b0 = (undefined1  [8])&local_8a0;
  local_688._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>._M_head_impl
       = (tuple<google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
          )operator_new(0x18);
  *(MessageGenerator **)
   local_688._M_t.
   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
   .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
   _M_head_impl = this;
  *(Printer ***)
   ((long)local_688._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
          .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
          _M_head_impl + 8) = &local_830;
  *(undefined1 *)
   ((long)local_688._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
          .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
          _M_head_impl + 0x10) = 0;
  local_670 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  _Stack_680._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>.
  _M_head_impl = (tuple<google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                  )(_Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                    )0x0;
  local_678 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_668 = 1;
  local_660.heap.control = local_650;
  local_660.heap.slot_array = (MaybeInitializedPtr)0x0;
  local_650[0] = ~kSentinel;
  local_640 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_660,0,(char *)0x0,0x36a4ec);
  local_5f8 = 0;
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"has_bits","");
  local_5f0 = &local_5e0;
  if (local_8d0[0] == local_8c0) {
    uStack_5d8 = local_8c0[1];
  }
  else {
    local_5f0 = local_8d0[0];
  }
  local_5e8 = local_8d0[1];
  local_8d0[1] = (long *)0x0;
  local_8c0[0]._0_1_ = 0;
  local_8d0[0] = local_8c0;
  local_5d0 = (undefined8 *)operator_new(0x28);
  *local_5d0 = this;
  local_5d0[1] = &local_830;
  local_5d0[2] = &local_820;
  local_5d0[3] = &local_992;
  *(undefined1 *)(local_5d0 + 4) = 0;
  local_5b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_5c8 = 0;
  local_5c0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_5b0 = 1;
  local_5a8 = local_598;
  local_5a0 = 0;
  local_598[0] = 0;
  local_588 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_5a8,0,(char *)0x0,0x36a4ec);
  local_540 = 0;
  local_8f0 = &local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"field_members","");
  local_538 = local_528;
  if (local_8f0 == &local_8e0) {
    uStack_520 = uStack_8d8;
  }
  else {
    local_538 = local_8f0;
  }
  local_530 = local_8e8;
  local_8e8 = 0;
  local_8e0 = 0;
  local_8f0 = &local_8e0;
  local_518 = (undefined8 *)operator_new(0x18);
  *local_518 = this;
  local_518[1] = &local_830;
  *(undefined1 *)(local_518 + 2) = 0;
  local_500 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_510 = 0;
  local_508 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_4f8 = 1;
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = 0;
  local_4d0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_4f0,0,(char *)0x0,0x36a4ec);
  local_488 = 0;
  local_910 = &local_900;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"decl_split","");
  local_480 = local_470;
  if (local_910 == &local_900) {
    uStack_468 = uStack_8f8;
  }
  else {
    local_480 = local_910;
  }
  local_478 = local_908;
  local_908 = 0;
  local_900 = 0;
  local_910 = &local_900;
  local_460 = (undefined8 *)operator_new(0x18);
  *local_460 = this;
  local_460[1] = &local_830;
  *(undefined1 *)(local_460 + 2) = 0;
  local_448 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_458 = 0;
  local_450 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_440 = 1;
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)0x0,0x36a4ec);
  local_3d0 = 0;
  local_930 = &local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"oneof_members","");
  local_3c8 = local_3b8;
  if (local_930 == &local_920) {
    uStack_3b0 = uStack_918;
  }
  else {
    local_3c8 = local_930;
  }
  local_3c0 = local_928;
  local_928 = 0;
  local_920 = 0;
  local_930 = &local_920;
  local_3a8 = (undefined8 *)operator_new(0x18);
  *local_3a8 = this;
  local_3a8[1] = &local_830;
  *(undefined1 *)(local_3a8 + 2) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x36a4ec);
  local_318 = 0;
  local_950 = &local_940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_950,"cached_size_if_no_hasbits","");
  local_310 = local_300;
  if (local_950 == &local_940) {
    uStack_2f8 = uStack_938;
  }
  else {
    local_310 = local_950;
  }
  local_308 = local_948;
  local_948 = 0;
  local_940 = 0;
  local_950 = &local_940;
  local_2f0 = (long *)operator_new(0x18);
  *local_2f0 = (long)&local_992;
  local_2f0[1] = (long)&local_830;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x36a4ec);
  local_260 = 0;
  local_970 = &local_960;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"oneof_case","");
  local_258 = local_248;
  if (local_970 == &local_960) {
    uStack_240 = uStack_958;
  }
  else {
    local_258 = local_970;
  }
  local_250 = local_968;
  local_968 = 0;
  local_960 = 0;
  local_970 = &local_960;
  local_238 = (undefined8 *)operator_new(0x18);
  *local_238 = this;
  local_238[1] = &local_830;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x36a4ec);
  local_1a8 = 0;
  local_990 = &local_980;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"weak_field_map","");
  local_1a0 = local_190;
  if (local_990 == &local_980) {
    uStack_188 = uStack_978;
  }
  else {
    local_1a0 = local_990;
  }
  local_198 = local_988;
  local_988 = 0;
  local_980 = 0;
  local_990 = &local_980;
  local_180 = (undefined8 *)operator_new(0x18);
  *local_180 = this;
  local_180[1] = &local_830;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x36a4ec);
  local_f0 = 0;
  local_850 = &local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"union_impl","");
  local_e8 = local_d8;
  if (local_850 == &local_840) {
    uStack_d0 = uStack_838;
  }
  else {
    local_e8 = local_850;
  }
  local_e0 = local_848;
  local_848 = 0;
  local_840 = 0;
  local_850 = &local_840;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = this;
  local_c8[1] = &local_830;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  uStack_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x36a4ec);
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (local_828,local_818,0xb,0x45f,
             "\n        struct Impl_ {\n          //~ TODO: check if/when there is a need for an\n          //~ outline dtor.\n          inline explicit constexpr Impl_(\n              ::$proto_ns$::internal::ConstantInitialized) noexcept;\n          inline explicit Impl_($pbi$::InternalVisibility visibility,\n                                ::$proto_ns$::Arena* arena);\n          inline explicit Impl_($pbi$::InternalVisibility visibility,\n                                ::$proto_ns$::Arena* arena, const Impl_& from,\n                                const $classname$& from_msg);\n          //~ Members assumed to align to 8 bytes:\n          $extension_set$;\n          $tracker$;\n          $inlined_string_donated$;\n          $has_bits$;\n          //~ Field members:\n          $field_members$;\n          $decl_split$;\n          $oneof_members$;\n          //~ Members assumed to align to 4 bytes:\n          $cached_size_if_no_hasbits$;\n          $oneof_case$;\n          $weak_field_map$;\n          //~ For detecting when concurrent accessor calls cause races.\n          PROTOBUF_TSAN_DECLARE_MEMBER\n        };\n        $union_impl$;\n      "
            );
  lVar4 = 0x7e8;
  do {
    if (*(char *)((long)&local_820 + lVar4) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_860 + lVar4));
    }
    if ((long *)((long)&lStack_878 + lVar4) != *(long **)((long)&local_888 + lVar4)) {
      operator_delete(*(long **)((long)&local_888 + lVar4),*(long *)((long)&lStack_878 + lVar4) + 1)
      ;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_890 + lVar4)]._M_data)
              (&local_991,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_8b0 + lVar4));
    *(undefined1 *)((long)&local_890 + lVar4) = 0xff;
    if ((long *)((long)local_8c0 + lVar4) != *(long **)((long)local_8d0 + lVar4)) {
      operator_delete(*(long **)((long)local_8d0 + lVar4),*(long *)((long)local_8c0 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if (local_850 != &local_840) {
    operator_delete(local_850,CONCAT71(uStack_83f,local_840) + 1);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990,CONCAT71(uStack_97f,local_980) + 1);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970,CONCAT71(uStack_95f,local_960) + 1);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950,CONCAT71(uStack_93f,local_940) + 1);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930,CONCAT71(uStack_91f,local_920) + 1);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910,CONCAT71(uStack_8ff,local_900) + 1);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0,CONCAT71(uStack_8df,local_8e0) + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],CONCAT71(local_8c0[0]._1_7_,(undefined1)local_8c0[0]) + 1);
  }
  if (local_8b0 != (undefined1  [8])&local_8a0) {
    operator_delete((void *)local_8b0,CONCAT71(uStack_89f,local_8a0) + 1);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890,CONCAT71(uStack_87f,local_880) + 1);
  }
  if (local_870 != local_860) {
    operator_delete(local_870,CONCAT71(local_860._1_7_,local_860[0]) + 1);
  }
  if (local_992 == '\x01') {
    GenerateImplDefinition((MessageGenerator *)local_818);
    lVar4 = 0x730;
    do {
      io::Printer::Sub::~Sub((Sub *)(local_818 + lVar4));
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != -0xb8);
    if (local_850 != &local_8e0) {
      operator_delete(local_850,CONCAT71(uStack_83f,local_840) + 1);
    }
    if (local_990 != &local_980) {
      operator_delete(local_990,CONCAT71(uStack_97f,local_980) + 1);
    }
    if (local_970 != &local_960) {
      operator_delete(local_970,CONCAT71(uStack_95f,local_960) + 1);
    }
    if (local_950 != &local_940) {
      operator_delete(local_950,CONCAT71(uStack_93f,local_940) + 1);
    }
    if (local_930 != &local_920) {
      operator_delete(local_930,CONCAT71(uStack_91f,local_920) + 1);
    }
    if (local_910 != &local_900) {
      operator_delete(local_910,CONCAT71(uStack_8ff,local_900) + 1);
    }
    if (local_8f0 != &local_8e0) {
      operator_delete(local_8f0,CONCAT71(uStack_8df,local_8e0) + 1);
    }
    if (local_8d0[0] != local_8c0) {
      operator_delete(local_8d0[0],CONCAT71(local_8c0[0]._1_7_,(undefined1)local_8c0[0]) + 1);
    }
    if (local_8b0 != (undefined1  [8])&local_8a0) {
      operator_delete((void *)local_8b0,CONCAT71(uStack_89f,local_8a0) + 1);
    }
    if (local_890 != &local_880) {
      operator_delete(local_890,CONCAT71(uStack_87f,local_880) + 1);
    }
    if (local_870 != local_860) {
      operator_delete(local_870,CONCAT71(local_860._1_7_,local_860[0]) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateImplDefinition(io::Printer* p) {
  // Prepare decls for _cached_size_ and _has_bits_.  Their position in the
  // output will be determined later.
  bool need_to_emit_cached_size = !HasSimpleBaseClass(descriptor_, options_);
  const size_t sizeof_has_bits = HasBitsSize();

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.
  p->Emit(
      {{"extension_set",
        [&] {
          if (descriptor_->extension_range_count() == 0) return;

          p->Emit(R"cc(
            ::$proto_ns$::internal::ExtensionSet _extensions_;
          )cc");
        }},
       {"tracker",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;

          p->Emit(R"cc(
            static ::$proto_ns$::AccessListener<$Msg$> _tracker_;
            static void TrackerOnGetMetadata() { $annotate_reflection$; }
          )cc");
        }},
       {"inlined_string_donated",
        [&] {
          // Generate _inlined_string_donated_ for inlined string type.
          // TODO: To avoid affecting the locality of
          // `_has_bits_`, should this be below or above `_has_bits_`?
          if (inlined_string_indices_.empty()) return;

          p->Emit({{"donated_size", InlinedStringDonatedSize()}},
                  R"cc(
                    ::$proto_ns$::internal::HasBits<$donated_size$>
                        _inlined_string_donated_;
                  )cc");
        }},
       {"has_bits",
        [&] {
          if (has_bit_indices_.empty()) return;

          // _has_bits_ is frequently accessed, so to reduce code size and
          // improve speed, it should be close to the start of the object.
          // Placing _cached_size_ together with _has_bits_ improves cache
          // locality despite potential alignment padding.
          p->Emit({{"sizeof_has_bits", sizeof_has_bits}}, R"cc(
            ::$proto_ns$::internal::HasBits<$sizeof_has_bits$> _has_bits_;
          )cc");
          if (need_to_emit_cached_size) {
            p->Emit(R"cc(
              ::$proto_ns$::internal::CachedSize _cached_size_;
            )cc");
            need_to_emit_cached_size = false;
          }
        }},
       {"field_members",
        [&] {
          // Emit some private and static members
          for (auto field : optimized_order_) {
            field_generators_.get(field).GenerateStaticMembers(p);
            if (!ShouldSplit(field, options_)) {
              field_generators_.get(field).GeneratePrivateMembers(p);
            }
          }
        }},
       {"decl_split",
        [&] {
          if (!ShouldSplit(descriptor_, options_)) return;
          p->Emit({{"split_field",
                    [&] {
                      for (auto field : optimized_order_) {
                        if (!ShouldSplit(field, options_)) continue;
                        field_generators_.get(field).GeneratePrivateMembers(p);
                      }
                    }}},
                  R"cc(
                    struct Split {
                      $split_field$;
                      using InternalArenaConstructable_ = void;
                      using DestructorSkippable_ = void;
                    };
                    static_assert(std::is_trivially_copy_constructible<Split>::value);
                    static_assert(std::is_trivially_destructible<Split>::value);
                    Split* _split_;
                  )cc");
        }},
       {"oneof_members",
        [&] {
          // For each oneof generate a union
          for (auto oneof : OneOfRange(descriptor_)) {
            // explicit empty constructor is needed when union contains
            // ArenaStringPtr members for string fields.
            p->Emit(
                {{"camel_oneof_name",
                  UnderscoresToCamelCase(oneof->name(), true)},
                 {"oneof_name", oneof->name()},
                 {"oneof_fields",
                  [&] {
                    for (auto field : FieldRange(oneof)) {
                      field_generators_.get(field).GeneratePrivateMembers(p);
                    }
                  }}},
                R"cc(
                  union $camel_oneof_name$Union {
                    constexpr $camel_oneof_name$Union() : _constinit_{} {}
                    ::$proto_ns$::internal::ConstantInitialized _constinit_;
                    $oneof_fields$;
                  } $oneof_name$_;
                )cc");
            for (auto field : FieldRange(oneof)) {
              field_generators_.get(field).GenerateStaticMembers(p);
            }
          }
        }},
       {"cached_size_if_no_hasbits",
        [&] {
          if (!need_to_emit_cached_size) return;

          need_to_emit_cached_size = false;
          p->Emit(R"cc(
            ::$proto_ns$::internal::CachedSize _cached_size_;
          )cc");
        }},
       {"oneof_case",
        [&] {
          // Generate _oneof_case_.
          if (descriptor_->real_oneof_decl_count() == 0) return;

          p->Emit({{"count", descriptor_->real_oneof_decl_count()}},
                  R"cc(
                    $uint32$ _oneof_case_[$count$];
                  )cc");
        }},
       {"weak_field_map",
        [&] {
          if (num_weak_fields_ == 0) return;

          p->Emit(R"cc(
            ::$proto_ns$::internal::WeakFieldMap _weak_field_map_;
          )cc");
        }},
       {"union_impl",
        [&] {
          // Only create the _impl_ field if it contains data.
          if (!HasImplData(descriptor_, options_)) return;

          // clang-format off
            p->Emit(R"cc(union { Impl_ _impl_; };)cc");
          // clang-format on
        }}},
      R"cc(
        struct Impl_ {
          //~ TODO: check if/when there is a need for an
          //~ outline dtor.
          inline explicit constexpr Impl_(
              ::$proto_ns$::internal::ConstantInitialized) noexcept;
          inline explicit Impl_($pbi$::InternalVisibility visibility,
                                ::$proto_ns$::Arena* arena);
          inline explicit Impl_($pbi$::InternalVisibility visibility,
                                ::$proto_ns$::Arena* arena, const Impl_& from,
                                const $classname$& from_msg);
          //~ Members assumed to align to 8 bytes:
          $extension_set$;
          $tracker$;
          $inlined_string_donated$;
          $has_bits$;
          //~ Field members:
          $field_members$;
          $decl_split$;
          $oneof_members$;
          //~ Members assumed to align to 4 bytes:
          $cached_size_if_no_hasbits$;
          $oneof_case$;
          $weak_field_map$;
          //~ For detecting when concurrent accessor calls cause races.
          PROTOBUF_TSAN_DECLARE_MEMBER
        };
        $union_impl$;
      )cc");

  ABSL_DCHECK(!need_to_emit_cached_size);
}